

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::Loop::GetInductionStepOperation(Loop *this,Instruction *induction)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  DefUseManager *this_00;
  CFG *this_01;
  BasicBlock *bb;
  Instruction *this_02;
  Instruction *pIVar4;
  uint32_t uVar5;
  
  if (induction->opcode_ != OpPhi) {
    __assert_fail("induction->opcode() == spv::Op::OpPhi",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                  ,0x27,
                  "Instruction *spvtools::opt::Loop::GetInductionStepOperation(const Instruction *) const"
                 );
  }
  this_00 = IRContext::get_def_use_mgr(this->context_);
  uVar5 = 0;
  while( true ) {
    uVar2 = Instruction::NumInOperands(induction);
    if (uVar2 <= uVar5 + 1) {
      return (Instruction *)0x0;
    }
    this_01 = IRContext::cfg(this->context_);
    uVar2 = Instruction::GetSingleWordInOperand(induction,uVar5 + 1);
    bb = CFG::block(this_01,uVar2);
    bVar1 = IsInsideLoop(this,bb);
    if (bVar1) break;
    uVar5 = uVar5 + 2;
  }
  uVar5 = Instruction::GetSingleWordInOperand(induction,uVar5);
  this_02 = analysis::DefUseManager::GetDef(this_00,uVar5);
  if ((this_02 != (Instruction *)0x0) && ((this_02->opcode_ & ~OpSourceContinued) == OpIAdd)) {
    uVar5 = Instruction::GetSingleWordInOperand(this_02,0);
    uVar2 = Instruction::GetSingleWordInOperand(this_02,1);
    uVar3 = Instruction::result_id(induction);
    if ((uVar5 == uVar3) || (uVar3 = Instruction::result_id(induction), uVar2 == uVar3)) {
      pIVar4 = analysis::DefUseManager::GetDef(this_00,uVar5);
      if (pIVar4->opcode_ == OpConstant) {
        return this_02;
      }
      pIVar4 = analysis::DefUseManager::GetDef(this_00,uVar2);
      if (pIVar4->opcode_ == OpConstant) {
        return this_02;
      }
    }
  }
  return (Instruction *)0x0;
}

Assistant:

Instruction* Loop::GetInductionStepOperation(
    const Instruction* induction) const {
  // Induction must be a phi instruction.
  assert(induction->opcode() == spv::Op::OpPhi);

  Instruction* step = nullptr;

  analysis::DefUseManager* def_use_manager = context_->get_def_use_mgr();

  // Traverse the incoming operands of the phi instruction.
  for (uint32_t operand_id = 1; operand_id < induction->NumInOperands();
       operand_id += 2) {
    // Incoming edge.
    BasicBlock* incoming_block =
        context_->cfg()->block(induction->GetSingleWordInOperand(operand_id));

    // Check if the block is dominated by header, and thus coming from within
    // the loop.
    if (IsInsideLoop(incoming_block)) {
      step = def_use_manager->GetDef(
          induction->GetSingleWordInOperand(operand_id - 1));
      break;
    }
  }

  if (!step || !IsSupportedStepOp(step->opcode())) {
    return nullptr;
  }

  // The induction variable which binds the loop must only be modified once.
  uint32_t lhs = step->GetSingleWordInOperand(0);
  uint32_t rhs = step->GetSingleWordInOperand(1);

  // One of the left hand side or right hand side of the step instruction must
  // be the induction phi and the other must be an OpConstant.
  if (lhs != induction->result_id() && rhs != induction->result_id()) {
    return nullptr;
  }

  if (def_use_manager->GetDef(lhs)->opcode() != spv::Op::OpConstant &&
      def_use_manager->GetDef(rhs)->opcode() != spv::Op::OpConstant) {
    return nullptr;
  }

  return step;
}